

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

int Fl::ready(void)

{
  int iVar1;
  
  if (first_timeout == (Timeout *)0x0) {
    reset_clock = '\x01';
  }
  else {
    elapse_timeouts();
    if (first_timeout->time <= 0.0) {
      return 1;
    }
  }
  iVar1 = fl_ready();
  return iVar1;
}

Assistant:

int Fl::ready() {
#if ! defined( WIN32 )  &&  ! defined(__APPLE__)
  if (first_timeout) {
    elapse_timeouts();
    if (first_timeout->time <= 0) return 1;
  } else {
    reset_clock = 1;
  }
#endif
  return fl_ready();
}